

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_clear(HTS_Engine *engine)

{
  size_t sVar1;
  HTS_ModelSet *pHVar2;
  long in_RDI;
  size_t i;
  HTS_ModelSet *in_stack_ffffffffffffffe0;
  HTS_ModelSet *local_10;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    HTS_free((void *)0x209853);
  }
  if (*(long *)(in_RDI + 0x70) != 0) {
    HTS_free((void *)0x20986d);
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    HTS_free((void *)0x209887);
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    local_10 = (HTS_ModelSet *)0x0;
    while( true ) {
      sVar1 = HTS_ModelSet_get_nvoices((HTS_ModelSet *)(in_RDI + 0xb0));
      if (sVar1 <= local_10) break;
      HTS_free((void *)0x2098db);
      local_10 = (HTS_ModelSet *)((long)local_10 + 1);
    }
    HTS_free((void *)0x2098f9);
  }
  if (*(long *)(in_RDI + 0x80) != 0) {
    local_10 = (HTS_ModelSet *)0x0;
    while( true ) {
      in_stack_ffffffffffffffe0 = local_10;
      pHVar2 = (HTS_ModelSet *)HTS_ModelSet_get_nvoices((HTS_ModelSet *)(in_RDI + 0xb0));
      if (pHVar2 <= in_stack_ffffffffffffffe0) break;
      HTS_free((void *)0x209953);
      local_10 = (HTS_ModelSet *)((long)&local_10->hts_voice_version + 1);
    }
    HTS_free((void *)0x209974);
  }
  HTS_ModelSet_clear(in_stack_ffffffffffffffe0);
  HTS_Audio_clear((HTS_Audio *)(in_RDI + 0x88));
  HTS_Engine_initialize((HTS_Engine *)0x2099a0);
  return;
}

Assistant:

void HTS_Engine_clear(HTS_Engine * engine)
{
   size_t i;

   if (engine->condition.msd_threshold != NULL)
      HTS_free(engine->condition.msd_threshold);
   if (engine->condition.duration_iw != NULL)
      HTS_free(engine->condition.duration_iw);
   if (engine->condition.gv_weight != NULL)
      HTS_free(engine->condition.gv_weight);
   if (engine->condition.parameter_iw != NULL) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(&engine->ms); i++)
         HTS_free(engine->condition.parameter_iw[i]);
      HTS_free(engine->condition.parameter_iw);
   }
   if (engine->condition.gv_iw != NULL) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(&engine->ms); i++)
         HTS_free(engine->condition.gv_iw[i]);
      HTS_free(engine->condition.gv_iw);
   }

   HTS_ModelSet_clear(&engine->ms);
   HTS_Audio_clear(&engine->audio);
   HTS_Engine_initialize(engine);
}